

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O0

void duckdb::FirstFunctionSimpleUpdate<unsigned_int,false,true>
               (Vector *inputs,AggregateInputData *aggregate_input_data,idx_t input_count,
               data_ptr_t state,idx_t count)

{
  Vector *in_RCX;
  AggregateInputData *in_R8;
  FirstState<unsigned_int> *agg_state;
  data_ptr_t in_stack_ffffffffffffffc8;
  
  if ((in_RCX->field_0x4 & 1) == 0) {
    AggregateFunction::
    UnaryUpdate<duckdb::FirstState<unsigned_int>,unsigned_int,duckdb::FirstFunction<false,true>>
              (in_RCX,in_R8,(idx_t)in_RCX,in_stack_ffffffffffffffc8,0xf56e70);
  }
  return;
}

Assistant:

static void FirstFunctionSimpleUpdate(Vector inputs[], AggregateInputData &aggregate_input_data, idx_t input_count,
                                      data_ptr_t state, idx_t count) {
	auto agg_state = reinterpret_cast<FirstState<T> *>(state);
	if (LAST || !agg_state->is_set) {
		// For FIRST, this skips looping over the input once the aggregate state has been set
		// FIXME: for LAST we could loop from the back of the Vector instead
		AggregateFunction::UnaryUpdate<FirstState<T>, T, FirstFunction<LAST, SKIP_NULLS>>(inputs, aggregate_input_data,
		                                                                                  input_count, state, count);
	}
}